

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

_Bool isKnownKeyValue(char *key)

{
  _Bool _Var1;
  int iVar2;
  char *in_RDI;
  char *in_stack_ffffffffffffffe8;
  _Bool local_1;
  
  _Var1 = isKnownKeyValueUINT32(in_stack_ffffffffffffffe8);
  if (_Var1) {
    local_1 = true;
  }
  else {
    _Var1 = isKnownKeyValueString(in_stack_ffffffffffffffe8);
    if (_Var1) {
      local_1 = true;
    }
    else {
      iVar2 = strcmp(in_RDI,"KTXglFormat");
      if (iVar2 == 0) {
        local_1 = true;
      }
      else {
        iVar2 = strcmp(in_RDI,"KTXanimData");
        if (iVar2 == 0) {
          local_1 = true;
        }
        else {
          iVar2 = strcmp(in_RDI,"KTXcubemapIncomplete");
          if (iVar2 == 0) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool isKnownKeyValue(const char* key) {
    if (isKnownKeyValueUINT32(key))
        return true;
    if (isKnownKeyValueString(key))
        return true;
    if (strcmp(key, "KTXglFormat") == 0)
        return true;
    if (strcmp(key, "KTXanimData") == 0)
        return true;
    if (strcmp(key, "KTXcubemapIncomplete") == 0)
        return true;
    return false;
}